

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles2::Functional::getCompressedTexSubImage2DFormat
               (vector<int,_std::allocator<int>_> *supported,
               vector<int,_std::allocator<int>_> *accepted)

{
  pointer piVar1;
  pointer piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __x;
  int i;
  long lVar3;
  GLuint *pGVar4;
  
  pGVar4 = getCompressedTexSubImage2DFormat::compressedTexSubImage2DFormats;
  lVar3 = 0;
  while( true ) {
    piVar1 = (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)piVar2 - (long)piVar1) >> 2) <= lVar3) break;
    __x = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                    (piVar1,piVar2,pGVar4);
    if (__x._M_current !=
        (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<int,_std::allocator<int>_>::push_back(accepted,__x._M_current);
    }
    lVar3 = lVar3 + 1;
    pGVar4 = pGVar4 + 1;
  }
  return;
}

Assistant:

static void getCompressedTexSubImage2DFormat(const vector<deInt32>& supported, vector<deInt32>& accepted)
{
	// Find a supported compressed texture format that is accepted by compressedTexSubImage2D()

	static const GLuint compressedTexSubImage2DFormats[] =
	{
		0x83F0,	// GL_COMPRESSED_RGB_S3TC_DXT1_EXT
		0x83F1,	// GL_COMPRESSED_RGBA_S3TC_DXT1_EXT
		0x8C00,	// GL_COMPRESSED_RGB_PVRTC_4BPPV1_IMG
		0x8C01,	// GL_COMPRESSED_RGB_PVRTC_2BPPV1_IMG
		0x8C02,	// GL_COMPRESSED_RGBA_PVRTC_4BPPV1_IMG
		0x8C03	// GL_COMPRESSED_RGBA_PVRTC_2BPPV1_IMG
	};

	for (int i = 0; i < (int)supported.size(); i++)
	{
		vector<deInt32>::const_iterator fmt = std::find(supported.begin(), supported.end(), compressedTexSubImage2DFormats[i]);
		if (fmt != supported.end())
			accepted.push_back(*fmt);
	}
}